

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O3

void __thiscall
AI::HierarchicalTaskNetworkComponent::recalculateLoci
          (HierarchicalTaskNetworkComponent *this,
          vector<int,_std::allocator<int>_> *updatedLociIndices)

{
  long lVar1;
  bool bVar2;
  pointer pFVar3;
  pointer pEVar4;
  ulong uVar5;
  pointer pEVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Vector3 local_d0;
  Vector3 local_c0;
  pointer local_b0;
  undefined1 local_a8 [16];
  int *local_90;
  HierarchicalTaskNetworkComponent *local_88;
  int *local_80;
  pointer local_78;
  pointer local_70;
  undefined1 local_68 [16];
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_80 = (updatedLociIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_90 = (updatedLociIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_80 != local_90) {
    local_88 = this;
    do {
      local_b0 = (local_88->state).memory.focusLocus.
                 super__Vector_base<AI::FocusLocus,_std::allocator<AI::FocusLocus>_>._M_impl.
                 super__Vector_impl_data._M_start + *local_80;
      pEVar4 = *(pointer *)
                &(local_b0->engrams).super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
                 _M_impl;
      local_70 = *(pointer *)
                  ((long)&(local_b0->engrams).
                          super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl + 8);
      if (pEVar4 == local_70) {
        local_58 = 0.0;
        local_a8 = ZEXT816(0);
        local_48 = 0.0;
        uVar8 = 0;
        pEVar6 = pEVar4;
      }
      else {
        local_48 = 0.0;
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        iVar7 = 0;
        local_a8 = ZEXT816(0);
        local_58 = 0.0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        lVar9 = 0;
        local_78 = pEVar4;
        do {
          local_c0.x = (pEVar4->stimulus).x;
          local_c0.y = (pEVar4->stimulus).y;
          local_c0.z = 0.0;
          local_d0._0_8_ = *(undefined8 *)((long)&(pEVar4->stimulus).x + lVar9);
          local_d0.z = 0.0;
          uStack_54 = uVar13;
          uStack_50 = uVar14;
          uStack_4c = uVar15;
          fVar10 = Math::distanceSquared(&local_c0,&local_d0);
          pFVar3 = local_b0;
          fVar12 = *(float *)((long)&(pEVar4->stimulus).intensity + lVar9);
          uVar13 = 0;
          uVar14 = 0;
          uVar15 = 0;
          if (lVar9 != 0) {
            lVar1 = *(long *)&(local_b0->engrams).
                              super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl;
            local_c0._0_8_ = *(undefined8 *)(lVar1 + lVar9);
            local_c0.z = 0.0;
            local_d0._0_8_ = *(undefined8 *)(lVar1 + -0x30 + lVar9);
            local_d0.z = 0.0;
            local_68 = ZEXT416((uint)fVar12);
            fVar11 = Math::distanceSquared(&local_c0,&local_d0);
            lVar1 = *(long *)&(pFVar3->engrams).
                              super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl;
            fVar12 = (float)(*(int *)(lVar1 + -4 + lVar9) - *(int *)(lVar1 + 0x2c + lVar9));
            if (fVar12 <= 1.0) {
              fVar12 = 1.0;
            }
            local_a8 = ZEXT416((uint)((float)local_a8._0_4_ + fVar11 / fVar12));
            pEVar4 = local_78;
            fVar12 = (float)local_68._0_4_;
            uVar13 = local_68._4_4_;
            uVar14 = local_68._8_4_;
            uVar15 = local_68._12_4_;
          }
          iVar7 = iVar7 + (uint)(10000.0 < fVar10);
          fVar10 = fVar12;
          if (fVar12 <= local_58) {
            fVar10 = local_58;
          }
          local_58 = (float)(~-(uint)NAN(local_58) & (uint)fVar10 |
                            -(uint)NAN(local_58) & (uint)fVar12);
          local_48 = local_48 + fVar12;
          pEVar6 = (pointer)((long)&pEVar4[1].stimulus.x + lVar9);
          lVar9 = lVar9 + 0x30;
        } while (pEVar6 != local_70);
        pEVar4 = *(pointer *)
                  ((long)&(local_b0->engrams).
                          super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>._M_impl + 8);
        uVar8 = (ulong)(uint)(iVar7 * 2);
        pEVar6 = *(pointer *)
                  &(local_b0->engrams).super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>.
                   _M_impl;
      }
      uVar5 = ((long)pEVar4 - (long)pEVar6 >> 4) * -0x5555555555555555;
      bVar2 = uVar5 < uVar8 || uVar5 - uVar8 == 0;
      if (bVar2) {
        local_58 = local_48 / (float)(long)uVar5 + (float)local_a8._0_4_ / (float)(uVar5 - 1);
      }
      else {
        local_b0->field_1 = (anon_union_4_2_313644d9_for_FocusLocus_1)0x42c80000;
      }
      local_b0->type = (uint)bVar2;
      local_b0->currentImportance = local_58;
      local_80 = local_80 + 1;
    } while (local_80 != local_90);
  }
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::recalculateLoci(std::vector<int> updatedLociIndices)
{
	const float maxDistanceToOrigin = 100.f * 100.f;
	
	for(auto id : updatedLociIndices)
	{
		//if all engrams are within a certain radius of the starting one, its an area loci
		//otherwise, its path
		auto& locus = state.memory.focusLocus[id];
		auto& origin = locus.engrams[0];
		unsigned int pastDistanceCount = 0;
		float maxDistance = maxDistanceToOrigin;
		float averageIntensity = 0.f;
		float maxIntensity = 0.f;
		float averageSpeed = 0.f;

		int i = 0;
		for (auto& engram : locus.engrams)
		{
			auto distance = distanceSquared({origin.stimulus.x, origin.stimulus.y, 0.f}, {engram.stimulus.x, engram.stimulus.y, 0.f});

			if (distance > maxDistanceToOrigin)
			{
				pastDistanceCount++;
			}

			maxDistance = fmax(maxDistance, distance);

			maxIntensity = fmax(maxIntensity, engram.stimulus.intensity);
			averageIntensity += engram.stimulus.intensity;

			if (i > 0)
			{
				auto speed = 
					distanceSquared(
						{locus.engrams[i].stimulus.x, locus.engrams[i].stimulus.y, 0.f},
						{locus.engrams[i - 1].stimulus.x, locus.engrams[i - 1].stimulus.y, 0.f})
					/ fmax(locus.engrams[i - 1].age - locus.engrams[i].age, 1);

				averageSpeed += speed;
			}

			i++;
		}

		averageIntensity /= locus.engrams.size();
		averageSpeed /= (locus.engrams.size() - 1);

		if (pastDistanceCount * 2u >= locus.engrams.size())
		{
			locus.type = FocusLocusType::Path;
			locus.currentImportance = averageIntensity + averageSpeed;
		}
		else
		{
			locus.type = FocusLocusType::Area;
			locus.area.radius = 100.f;
			locus.currentImportance = maxIntensity;
		}	
	}
}